

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marketgenerator.cpp
# Opt level: O0

void __thiscall
hedg::MarketGenerator::MarketGenerator(MarketGenerator *this,int time_span,time_unit time_unit)

{
  time_unit time_unit_local;
  int time_span_local;
  MarketGenerator *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->time_span_ = time_span;
  this->time_unit_ = time_unit;
  std::condition_variable::condition_variable(&this->data_cond_);
  std::mutex::mutex(&this->mut_);
  std::
  queue<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>>
  ::
  queue<std::deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>,void>
            ((queue<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>>
              *)&this->markets_);
  return;
}

Assistant:

MarketGenerator::MarketGenerator(int time_span, Timing::time_unit time_unit) : time_span_{ time_span }, time_unit_{ time_unit } {}